

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DeviceWaitForFence
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,IFence *pFence,Uint64 Value,
          int param_3)

{
  bool bVar1;
  int iVar2;
  Char *pCVar3;
  undefined4 extraout_var;
  undefined1 local_98 [8];
  string msg_2;
  string msg_1;
  undefined1 local_48 [8];
  string msg;
  int param_3_local;
  Uint64 Value_local;
  IFence *pFence_local;
  DeviceContextBase<Diligent::EngineVkImplTraits> *this_local;
  
  msg.field_2._12_4_ = param_3;
  bVar1 = IsDeferred(this);
  if (bVar1) {
    FormatString<char[48]>
              ((string *)local_48,(char (*) [48])"Fence can only be waited from immediate context");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"DeviceWaitForFence",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x6ab);
    std::__cxx11::string::~string((string *)local_48);
  }
  if (pFence == (IFence *)0x0) {
    FormatString<char[23]>((string *)((long)&msg_2.field_2 + 8),(char (*) [23])0xe4d34e);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"DeviceWaitForFence",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x6ac);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  iVar2 = (*(pFence->super_IDeviceObject).super_IObject._vptr_IObject[4])();
  if (*(char *)(CONCAT44(extraout_var,iVar2) + 8) != '\x01') {
    FormatString<char[46]>
              ((string *)local_98,(char (*) [46])"Fence must be created with FENCE_TYPE_GENERAL");
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"DeviceWaitForFence",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x6ad);
    std::__cxx11::string::~string((string *)local_98);
  }
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::DeviceWaitForFence(IFence* pFence, Uint64 Value, int)
{
    DEV_CHECK_ERR(!IsDeferred(), "Fence can only be waited from immediate context");
    DEV_CHECK_ERR(pFence, "Fence must not be null");
    DEV_CHECK_ERR(pFence->GetDesc().Type == FENCE_TYPE_GENERAL, "Fence must be created with FENCE_TYPE_GENERAL");
}